

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O1

Error asmjit::X86Internal::emitRegMove
                (X86Emitter *emitter,Operand_ *dst_,Operand_ *src_,uint32_t typeId,bool avxEnabled,
                char *comment)

{
  byte bVar1;
  Reg *pRVar2;
  uint uVar3;
  Error EVar4;
  uint uVar5;
  Error EVar6;
  uint32_t uVar7;
  undefined4 in_register_0000000c;
  uint32_t (*pauVar8) [2];
  ulong uVar9;
  ulong extraout_RDX;
  ulong uVar10;
  uint32_t uVar11;
  undefined7 in_register_00000081;
  char cVar12;
  undefined4 uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint32_t instId;
  byte bVar19;
  bool bVar20;
  Operand dst;
  Operand src;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_118;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_108;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_f8;
  Operand_ *pOStack_e0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_d8;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_c8;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_b0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_70;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_60;
  anon_union_16_7_ed616b9d_for_Operand__0 local_28;
  anon_union_16_7_ed616b9d_for_Operand__0 local_18;
  
  uVar9 = CONCAT71(in_register_00000081,avxEnabled);
  pauVar8 = (uint32_t (*) [2])CONCAT44(in_register_0000000c,typeId);
  if ((0xffffffba < typeId - 0x65) && ((typeId & 0x7e) != 0x20)) {
    local_28._packed[0] = (UInt64)*(undefined8 *)&dst_->field_0;
    local_28._mem.field_2 = (dst_->field_0)._mem.field_2;
    local_18._packed[0] = (UInt64)*(undefined8 *)&src_->field_0;
    local_18._mem.field_2 = (src_->field_0)._mem.field_2;
    bVar19 = (local_28._any.signature & 7) == 2;
    if ((bool)bVar19) {
      local_28._any.signature =
           local_28._any.signature & 0xfffffa | (uint)(byte)local_18._any.signature._3_1_ << 0x18;
    }
    if ((local_18._any.signature & 7) == 2) {
      bVar19 = bVar19 | 2;
      local_18._any.signature =
           local_18._any.signature & 0xfffffa |
           (uint)(((ulong)local_28._packed[0] >> 0x18 & 0xff) << 0x18);
    }
    uVar11 = 0x189;
    switch(typeId) {
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
      if ((bVar19 & 2) == 0) {
        if (bVar19 == 0) {
          local_28._any.signature = 0x4000029;
          local_18._any.signature = 0x4000029;
        }
      }
      else {
        local_28._any.signature = 0x4000029;
      }
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
      break;
    default:
      dst_ = (Operand_ *)0x189;
      if (typeId < 0x80) {
        bVar1 = TypeId::_info[(ulong)typeId + 0x80];
        if (bVar19 == 0 || 9 < typeId - 0x33) {
          if (9 < typeId - 0x3d || bVar19 == 0) {
            if (bVar1 == 0x2b) {
              uVar7 = 0x3dd;
              uVar11 = 0x18a;
            }
            else if (bVar1 == 0x2a) {
              uVar7 = 0x3de;
              uVar11 = 0x18b;
            }
            else {
              if (0x5a < typeId) {
                uVar11 = 0x3e3 - (bVar1 < 0x28);
                break;
              }
              uVar7 = 0x3e1;
              uVar11 = 400;
            }
            if (avxEnabled) {
              uVar11 = uVar7;
            }
            break;
          }
          uVar7 = 0x1a5;
          if (avxEnabled) {
            uVar7 = 0x3f6;
          }
          uVar11 = 0x1a2;
          if (avxEnabled) {
            uVar11 = 0x3f5;
          }
          bVar20 = bVar1 == 0x2b;
        }
        else {
          uVar7 = 0x1a8;
          if (avxEnabled) {
            uVar7 = 0x3f9;
          }
          uVar11 = 0x18d;
          if (avxEnabled) {
            uVar11 = 0x3df;
          }
          bVar20 = bVar1 == 0x2a;
        }
        if (bVar20) {
          uVar11 = uVar7;
        }
        break;
      }
      goto LAB_001229d8;
    case 0x2d:
      uVar11 = 0x13f;
      break;
    case 0x2e:
      uVar11 = 0x142;
      break;
    case 0x2f:
      uVar11 = 0x140;
      break;
    case 0x30:
      uVar11 = 0x141;
      break;
    case 0x31:
      uVar11 = 0x18d;
      if (bVar19 != 0) break;
    case 0x32:
      uVar11 = 0x1a2;
    }
    *(char **)(emitter + 0x40) = comment;
    EVar4 = CodeEmitter::emit((CodeEmitter *)emitter,uVar11,(Operand_ *)&local_28._any,
                              (Operand_ *)&local_18._any);
    return EVar4;
  }
  emitRegMove();
LAB_001229d8:
  cVar12 = (char)comment;
  emitRegMove();
  uVar10 = extraout_RDX;
  if ((int)extraout_RDX == 0) {
    uVar10 = (ulong)(byte)x86OpData[(ulong)((dst_->field_0)._any.signature >> 3 & 0x1f) + 0xa0];
  }
  uVar17 = (uint)uVar10;
  EVar4 = uVar17 - 0x20;
  if ((EVar4 < 0x45) && ((uVar17 & 0x7e) != 0x20)) {
    uVar3 = (uint)uVar9;
    uVar5 = uVar3 - 0x20;
    if ((0x44 < uVar5) || ((uVar3 & 0x7e) == 0x20)) goto LAB_00122f97;
    aStack_60._packed[0] = (UInt64)*(undefined8 *)&dst_->field_0;
    aStack_60._mem.field_2 = (dst_->field_0)._mem.field_2;
    aStack_70._packed[0] = (UInt64)*pauVar8;
    aStack_70._mem.field_2 = *(anon_union_8_2_78723da6_for_MemData_2 *)(pauVar8 + 1);
    if (uVar17 < 0x80) {
      if (0x7f < uVar3) goto LAB_00122fa1;
      bVar19 = TypeId::_info[uVar10 & 0xffffffff];
      uVar15 = (uint)bVar19;
      uVar14 = (uint)(byte)TypeId::_info[uVar9 & 0xffffffff];
      uVar11 = 0;
      if (EVar4 < 10) {
        uVar11 = 0;
        if (uVar5 < 10) {
          uVar16 = uVar17 << 8 | uVar3;
          uVar11 = 0x1a9;
          bVar20 = false;
          if ((int)uVar16 < 0x2822) {
            if (((uVar16 != 0x2422) && (uVar16 != 0x2622)) && (uVar16 != 0x2624)) {
LAB_00122ae8:
              uVar11 = 0x1aa;
              bVar20 = true;
            }
          }
          else if ((uVar16 != 0x2822) && (uVar16 != 0x2824)) {
            if (uVar16 != 0x2826) goto LAB_00122ae8;
            uVar11 = 0x1aa;
            bVar20 = false;
          }
          if (!bVar20) goto LAB_00122dae;
        }
        if ((uVar5 < 10) || (((*pauVar8)[0] & 7) == 2)) {
          if ((bVar19 < 5) && ((byte)TypeId::_info[uVar9 & 0xffffffff] < 4)) {
            aStack_60._any.signature = 0x4000029;
            uVar11 = 0x1ad;
          }
          else {
            if (uVar15 < uVar14) {
              uVar14 = uVar15;
            }
            aStack_60._any.signature = 0x8000031;
            if (uVar14 == 4) {
              aStack_60._any.signature = 0x4000029;
            }
            uVar11 = 0x189;
            if ((aStack_70._any.signature & 7) == 1) {
              aStack_70._any.signature = aStack_60._any.signature;
            }
          }
          goto LAB_00122dae;
        }
        if (uVar15 < uVar14) {
          uVar14 = uVar15;
        }
        if (uVar3 - 0x31 < 2) {
          uVar11 = 0x1a2;
          if (uVar14 != 8) {
            aStack_60._any.signature = 0x4000029;
            uVar11 = 0x18d;
          }
          goto LAB_00122dae;
        }
        if (uVar3 - 0x2d < 4) {
          if (uVar14 == 1) {
            uVar11 = 0x13f;
          }
          else if (uVar14 == 2) {
            uVar11 = 0x142;
          }
          else {
            uVar11 = uVar14 == 4 ^ 0x141;
          }
          aStack_60._any.signature = 0x8000031;
          if (uVar14 < 5) {
            aStack_60._any.signature = 0x4000029;
          }
          goto LAB_00122dae;
        }
        if (uVar3 - 0x33 < 0x32) {
          uVar11 = 0x1a2;
          if (cVar12 != '\0') {
            uVar11 = 0x3f5;
          }
          if (uVar14 != 8) {
            uVar11 = 0x18d;
            if (cVar12 != '\0') {
              uVar11 = 0x3df;
            }
            aStack_60._any.signature = 0x4000029;
          }
          goto LAB_00122dae;
        }
      }
      uVar16 = (uint)bVar19;
      if (uVar17 - 0x31 < 2) {
        if (uVar16 <= uVar14) {
          uVar14 = uVar16;
        }
        if ((9 < uVar5) && ((aStack_70._any.signature & 7) != 2)) {
          uVar11 = 0x1a2;
          if ((uVar3 - 0x31 < 2) || (uVar11 = 399, uVar3 - 0x33 < 0x32)) goto LAB_00122dae;
          goto LAB_00122c61;
        }
        uVar11 = 0x1a2;
        if ((uVar14 == 8) || (uVar11 = 0x18d, (aStack_70._any.signature & 7) != 1))
        goto LAB_00122dae;
LAB_00122da7:
        aStack_70._any.signature = 0x4000029;
        goto LAB_00122dae;
      }
LAB_00122c61:
      if (uVar17 - 0x2d < 4) {
        if (uVar16 <= uVar14) {
          uVar14 = uVar16;
        }
        if ((uVar3 - 0x2d < 4 || uVar5 < 10) || ((aStack_70._any.signature & 7) == 2)) {
          if (uVar14 == 1) {
            uVar11 = 0x13f;
          }
          else if (uVar14 == 2) {
            uVar11 = 0x142;
          }
          else {
            uVar11 = uVar14 == 4 ^ 0x141;
          }
          if (((aStack_70._any.signature & 0xf07) != 1) || (4 < uVar14)) goto LAB_00122dae;
          goto LAB_00122da7;
        }
      }
      if (0x31 < uVar17 - 0x33) {
        return 4;
      }
      aStack_60._any.signature = 0x10000149;
      if (aStack_70._any.signature == 0x8000289) {
        uVar11 = 0x1a3;
        goto LAB_00122dae;
      }
      if (TypeId::_info[(uVar9 & 0xffffffff) + 0x80] == '+' &&
          TypeId::_info[(uVar10 & 0xffffffff) + 0x80] == '*') {
        uVar16 = uVar15 * 2;
        if (uVar14 < uVar15 * 2) {
          uVar16 = uVar14;
        }
        uVar7 = 0x83;
        if (cVar12 != '\0') {
          uVar7 = 0x324;
        }
        uVar11 = 0x7d;
        if (cVar12 != '\0') {
          uVar11 = 0x318;
        }
        if (uVar16 < 9) {
          uVar11 = uVar7;
        }
        if ((uVar16 & 0xfe) == 0x40) {
          aStack_60._any.signature = 0x20000151;
        }
        if ((aStack_70._any.signature & 7) == 1) {
          uVar13 = 0x40000159;
          if (uVar16 < 0x21) {
            uVar13 = 0x20000151;
          }
          aStack_70._any.signature = 0x10000149;
          if (0x10 < uVar16) {
            aStack_70._any.signature = uVar13;
          }
        }
LAB_00122f80:
        bVar20 = false;
        uVar14 = uVar16;
      }
      else {
        if (TypeId::_info[(uVar9 & 0xffffffff) + 0x80] != '*' ||
            TypeId::_info[(uVar10 & 0xffffffff) + 0x80] != '+') {
          if (uVar14 < uVar16) {
            uVar16 = uVar14;
          }
          if ((aStack_70._any.signature & 0xf07) == 1 || (aStack_70._any.signature & 7) == 2) {
            if (uVar16 < 5) {
              uVar11 = 0x18d;
              if (cVar12 != '\0') {
                uVar11 = 0x3df;
              }
              if ((aStack_70._any.signature & 3) == 1) {
                aStack_70._any.signature = 0x4000029;
              }
            }
            else {
              if (uVar16 != 8) goto LAB_00122f28;
              uVar11 = 0x1a2;
              if (cVar12 != '\0') {
                uVar11 = 0x3f5;
              }
            }
          }
          else {
LAB_00122f28:
            bVar20 = true;
            uVar14 = uVar16;
            if ((aStack_70._any.signature & 0xf07) != 0x101 && (aStack_70._any.signature & 7) != 2)
            goto LAB_00122f82;
            uVar11 = 0x18b;
            if (cVar12 != '\0') {
              uVar11 = 0x3de;
            }
            uVar13 = 0x40000159;
            if (uVar16 < 0x21) {
              uVar13 = 0x20000151;
            }
            aStack_60._any.signature = 0x10000149;
            if (0x10 < uVar16) {
              aStack_60._any.signature = uVar13;
            }
            if ((aStack_70._any.signature & 3) == 1) {
              aStack_70._any.signature = aStack_60._any.signature;
            }
          }
          goto LAB_00122f80;
        }
        uVar17 = uVar14 * 2;
        if (uVar16 <= uVar14 * 2) {
          uVar17 = uVar16;
        }
        uVar16 = uVar17 >> 1;
        uVar7 = 0x80;
        if (cVar12 != '\0') {
          uVar7 = 800;
        }
        uVar11 = 0x79;
        if (cVar12 != '\0') {
          uVar11 = 0x312;
        }
        if (uVar17 < 10) {
          uVar11 = uVar7;
        }
        uVar13 = 0x40000159;
        if ((uVar17 & 0xfe) < 0x21) {
          uVar13 = 0x20000151;
        }
        aStack_60._any.signature = 0x10000149;
        if (0x10 < (uVar17 & 0xfe)) {
          aStack_60._any.signature = uVar13;
        }
        bVar20 = false;
        uVar14 = uVar16;
        if (((aStack_70._any.signature & 7) == 1) && (0x3f < uVar17)) {
          aStack_70._any.signature = 0x20000151;
          goto LAB_00122f80;
        }
      }
LAB_00122f82:
      if (bVar20) {
        return 4;
      }
LAB_00122dae:
      if ((aStack_70._any.signature & 7) == 2) {
        aStack_70._any.signature = uVar14 << 0x18 | aStack_70._any.signature & 0xfffffa;
      }
      ((CodeEmitter *)emitter)->_inlineComment = (char *)local_28._mem.field_2;
      EVar4 = CodeEmitter::emit((CodeEmitter *)emitter,uVar11,(Operand_ *)&aStack_60._any,
                                (Operand_ *)&aStack_70._any);
      return EVar4;
    }
  }
  else {
    emitArgMove();
LAB_00122f97:
    emitArgMove();
  }
  emitArgMove();
LAB_00122fa1:
  emitArgMove();
  uVar17 = (dst_->field_0)._any.id;
  pRVar2 = ((CodeEmitter *)emitter)->_nativeGpArray;
  aStack_118._packed[0] = *(UInt64 *)(pRVar2 + 4);
  aStack_118._mem.field_2 = pRVar2[4].super_Operand.super_Operand_.field_0._mem.field_2;
  aStack_f8._mem.field_2 = pRVar2[4].super_Operand.super_Operand_.field_0._mem.field_2;
  aStack_f8._any.signature =
       (uint32_t)*(undefined8 *)&pRVar2[4].super_Operand.super_Operand_.field_0;
  aStack_f8._any.id = 5;
  aStack_c8._packed[0] = (UInt64)((UInt64 *)(pRVar2 + 4))->field_11;
  aStack_c8._mem.field_2 = pRVar2[4].super_Operand.super_Operand_.field_0._mem.field_2;
  aStack_108._packed[0] = (UInt64)((UInt64 *)(pRVar2 + 4))->field_11;
  aStack_108._mem.field_2 = pRVar2[4].super_Operand.super_Operand_.field_0._mem.field_2;
  if ((undefined1  [16])((undefined1  [16])dst_[1].field_0 & (undefined1  [16])0x100000000) !=
      (undefined1  [16])0x0) {
    EVar4 = CodeEmitter::emit((CodeEmitter *)emitter,0x263,(Operand_ *)&aStack_f8._any);
    if (EVar4 != 0) {
      return EVar4;
    }
    EVar4 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_f8._any,
                              (Operand_ *)&aStack_118._any);
    if (EVar4 != 0) {
      return EVar4;
    }
    uVar17 = uVar17 & 0xffffffdf;
    EVar4 = 0;
  }
  if (uVar17 != 0) {
    bVar20 = false;
    iVar18 = 0;
    pOStack_e0 = dst_;
    do {
      if ((uVar17 & 1) != 0) {
        aStack_c8._any.id = iVar18;
        EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x263,(Operand_ *)&aStack_c8._any);
        if (EVar6 != 0) break;
      }
      iVar18 = iVar18 + 1;
      bVar20 = uVar17 < 2;
      uVar17 = uVar17 >> 1;
      EVar6 = EVar4;
    } while (!bVar20);
    EVar4 = EVar6;
    dst_ = pOStack_e0;
    if (!bVar20) {
      return EVar4;
    }
  }
  cVar12 = *(char *)((long)&dst_->field_0 + 2);
  if ((cVar12 != '\x04') && (cVar12 != -1)) {
    aStack_108._any.id._0_1_ = cVar12;
    aStack_108._any.id._1_3_ = 0;
    if (((cVar12 != '\x05') ||
        ((undefined1  [16])((undefined1  [16])dst_[1].field_0 & (undefined1  [16])0x100000000) ==
         (undefined1  [16])0x0)) &&
       (EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_108._any,
                                  (Operand_ *)&aStack_118._any), EVar6 != 0)) {
      return EVar6;
    }
  }
  if ((((undefined1  [16])((undefined1  [16])dst_[1].field_0 & (undefined1  [16])0x800000000) ==
        (undefined1  [16])0x0) ||
      (EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x15,(Operand_ *)&aStack_118._any,
                                 -(uint)*(byte *)&dst_->field_0), EVar6 == 0)) &&
     ((uVar9 = (ulong)dst_[2].field_0._any.signature, uVar9 == 0 ||
      (EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x2c4,(Operand_ *)&aStack_118._any,uVar9),
      EVar6 == 0)))) {
    if ((~*(byte *)((long)&dst_[1].field_0 + 4) & 10) == 0) {
      aStack_d8._any.reserved8_4 = dst_[2].field_0._any.reserved8_4;
      aStack_d8._packed[0] = (UInt64)((ulong)(aStack_118._any.signature & 0xf8) | 2);
      aStack_d8._any.reserved12_4 = aStack_118._any.id;
      EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_d8._any,
                                (Operand_ *)&aStack_108._any);
      if (EVar6 != 0) {
        return EVar6;
      }
    }
    uVar11 = (dst_->field_0)._any.reserved8_4;
    if (uVar11 != 0) {
      aStack_d8._any.reserved8_4 = dst_[3].field_0._any.reserved8_4;
      aStack_d8._packed[0] = (UInt64)((ulong)(aStack_118._any.signature & 0xf8) | 2);
      aStack_d8._any.reserved12_4 = aStack_118._any.id;
      aStack_b0._packed[0] = (UInt64)0x10000149;
      aStack_b0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
      bVar20 = (undefined1  [16])
               ((undefined1  [16])dst_[1].field_0 & (undefined1  [16])0x4000000000) ==
               (undefined1  [16])0x0;
      uVar7 = 0x3de;
      if (bVar20) {
        uVar7 = 0x18b;
      }
      instId = 0x3fb;
      if (bVar20) {
        instId = 0x1ac;
      }
      if ((undefined1  [16])((undefined1  [16])dst_[1].field_0 & (undefined1  [16])0x400000000) !=
          (undefined1  [16])0x0) {
        instId = uVar7;
      }
      bVar20 = false;
      iVar18 = 0;
      do {
        if ((uVar11 & 1) != 0) {
          aStack_b0._any.id = iVar18;
          EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,instId,(Operand_ *)&aStack_d8._any,
                                    (Operand_ *)&aStack_b0._any);
          if (EVar6 != 0) break;
          aStack_d8._any.reserved8_4 = aStack_d8._any.reserved8_4 + 0x10;
        }
        iVar18 = iVar18 + 1;
        bVar20 = uVar11 < 2;
        uVar11 = uVar11 >> 1;
        EVar6 = EVar4;
      } while (!bVar20);
      if (!bVar20) {
        return EVar6;
      }
    }
    EVar6 = 0;
  }
  return EVar6;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::emitRegMove(X86Emitter* emitter,
  const Operand_& dst_,
  const Operand_& src_, uint32_t typeId, bool avxEnabled, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeId::isValid(typeId) && !TypeId::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  uint32_t instId = Globals::kInvalidInstId;
  uint32_t memFlags = 0;

  enum MemFlags {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register.
  // CodeCompiler always sets memory size of allocs and spills, so it shouldn't
  // be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use
  // 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<X86Mem>().setSize(src.getSize()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<X86Mem>().setSize(dst.getSize()); }

  switch (typeId) {
    case TypeId::kI8:
    case TypeId::kU8:
    case TypeId::kI16:
    case TypeId::kU16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = X86Inst::kIdMovzx;
        dst.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
      }
      else if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
        src.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kI32:
    case TypeId::kU32:
    case TypeId::kI64:
    case TypeId::kU64:
      instId = X86Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = X86Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;
    case TypeId::kMmx64 : instId = X86Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = X86Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = X86Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = X86Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = X86Inst::kIdKmovq; break;

    default: {
      uint32_t elementTypeId = TypeId::elementOf(typeId);
      if (TypeId::isVec32(typeId) && memFlags) {
        if (elementTypeId == TypeId::kF32)
          instId = avxEnabled ? X86Inst::kIdVmovss : X86Inst::kIdMovss;
        else
          instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
        break;
      }

      if (TypeId::isVec64(typeId) && memFlags) {
        if (elementTypeId == TypeId::kF64)
          instId = avxEnabled ? X86Inst::kIdVmovsd : X86Inst::kIdMovsd;
        else
          instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
        break;
      }

      if (elementTypeId == TypeId::kF32)
        instId = avxEnabled ? X86Inst::kIdVmovaps : X86Inst::kIdMovaps;
      else if (elementTypeId == TypeId::kF64)
        instId = avxEnabled ? X86Inst::kIdVmovapd : X86Inst::kIdMovapd;
      else if (typeId <= TypeId::_kVec256End)
        instId = avxEnabled ? X86Inst::kIdVmovdqa : X86Inst::kIdMovdqa;
      else if (elementTypeId <= TypeId::kU32)
        instId = X86Inst::kIdVmovdqa32;
      else
        instId = X86Inst::kIdVmovdqa64;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  emitter->setInlineComment(comment);
  return emitter->emit(instId, dst, src);
}